

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O0

int idaLsJacBWrapper(sunrealtype tt,sunrealtype c_jB,N_Vector yyB,N_Vector ypB,N_Vector rrB,
                    SUNMatrix JacB,void *ida_mem,N_Vector tmp1B,N_Vector tmp2B,N_Vector tmp3B)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  int retval;
  IDALsMemB idalsB_mem;
  IDABMem IDAB_mem;
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDABMem *in_stack_ffffffffffffff58;
  IDAadjMem *in_stack_ffffffffffffff60;
  IDAMem *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  void *in_stack_ffffffffffffff78;
  int local_14;
  
  idaLs_AccessLMemBCur
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(IDALsMemB *)0x137113);
  if ((iRam00000000000000c0 == 0) &&
     (iVar1 = (*pcRam0000000000000098)(in_XMM0_Qa,0,uRam0000000000000158,uRam0000000000000160,0),
     iVar1 != 0)) {
    IDAProcessError(pIRam0000000000000010,-1,0x8a2,"idaLsJacBWrapper",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                    ,"Bad t for interpolation.");
    local_14 = -1;
  }
  else {
    local_14 = (*pcRam0000000000000000)
                         (in_XMM0_Qa,in_XMM1_Qa,uRam0000000000000158,uRam0000000000000160,in_RDI,
                          in_RSI,in_RDX,in_RCX,uRam0000000000000040,in_R9,in_stack_00000008,
                          in_stack_00000010);
  }
  return local_14;
}

Assistant:

static int idaLsJacBWrapper(sunrealtype tt, sunrealtype c_jB, N_Vector yyB,
                            N_Vector ypB, N_Vector rrB, SUNMatrix JacB,
                            void* ida_mem, N_Vector tmp1B, N_Vector tmp2B,
                            N_Vector tmp3B)
{
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  IDABMem IDAB_mem;
  IDALsMemB idalsB_mem;
  int retval;

  /* access relevant memory structures */
  IDA_mem    = NULL;
  IDAADJ_mem = NULL;
  idalsB_mem = NULL;
  IDAB_mem   = NULL;
  retval     = idaLs_AccessLMemBCur(ida_mem, __func__, &IDA_mem, &IDAADJ_mem,
                                    &IDAB_mem, &idalsB_mem);

  /* Forward solution from interpolation */
  if (IDAADJ_mem->ia_noInterp == SUNFALSE)
  {
    retval = IDAADJ_mem->ia_getY(IDA_mem, tt, IDAADJ_mem->ia_yyTmp,
                                 IDAADJ_mem->ia_ypTmp, NULL, NULL);
    if (retval != IDA_SUCCESS)
    {
      IDAProcessError(IDAB_mem->IDA_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_LS_BAD_T);
      return (-1);
    }
  }

  /* Call user's adjoint jacB routine */
  return (idalsB_mem->jacB(tt, c_jB, IDAADJ_mem->ia_yyTmp, IDAADJ_mem->ia_ypTmp,
                           yyB, ypB, rrB, JacB, IDAB_mem->ida_user_data, tmp1B,
                           tmp2B, tmp3B));
}